

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_IRCJoin.cpp
# Opt level: O3

bool __thiscall RenX_IRCJoinPlugin::initialize(RenX_IRCJoinPlugin *this)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  undefined1 auVar5 [16];
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = 10;
  local_28._M_str = "PublicOnly";
  puVar1 = &this->field_0x60;
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)puVar1,&local_28);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = true;
  }
  else {
    in_string._M_str = extraout_RDX;
    in_string._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar2 = Jupiter::asBool<char>
                      (*(Jupiter **)
                        ((long)cVar4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),in_string);
  }
  this->publicOnly = bVar2;
  local_28._M_len = 0xe;
  local_28._M_str = "Join.MsgAlways";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)puVar1,&local_28);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    in_string_00._M_str = extraout_RDX_00;
    in_string_00._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar2 = Jupiter::asBool<char>
                      (*(Jupiter **)
                        ((long)cVar4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),in_string_00);
  }
  this->joinMsgAlways = bVar2;
  local_28._M_len = 0xe;
  local_28._M_str = "Part.MsgAlways";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)puVar1,&local_28);
  iVar3 = 0;
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    in_string_01._M_str = extraout_RDX_01;
    in_string_01._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar2 = Jupiter::asBool<char>
                      (*(Jupiter **)
                        ((long)cVar4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),in_string_01);
  }
  this->partMsgAlways = bVar2;
  local_28._M_len = 0xe;
  local_28._M_str = "Part.MinAccess";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)puVar1,&local_28);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    iVar3 = Jupiter_strtoi_s(*(undefined8 *)
                              ((long)cVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x28),
                             *(undefined8 *)
                              ((long)cVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x30),0);
  }
  this->minAccessPartMessage = iVar3;
  local_28._M_len = 0xe;
  local_28._M_str = "Part.MaxAccess";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)puVar1,&local_28);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = Jupiter_strtoi_s(*(undefined8 *)
                              ((long)cVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x28),
                             *(undefined8 *)
                              ((long)cVar4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x30),0);
  }
  puVar1 = &this->field_0x38;
  this->maxAccessPartMessage = iVar3;
  auVar5 = Jupiter::Config::get(puVar1,7,"NameTag",6,"{NAME}");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->nameTag,0,(this->nameTag)._M_string_length,auVar5._8_8_,auVar5._0_8_);
  auVar5 = Jupiter::Config::get(puVar1,10,"ChannelTag",6,"{CHAN}");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->chanTag,0,(this->chanTag)._M_string_length,auVar5._8_8_,auVar5._0_8_);
  auVar5 = Jupiter::Config::get(puVar1,0xd,"PartReasonTag",8,"{REASON}");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->partReasonTag,0,(this->partReasonTag)._M_string_length,auVar5._8_8_,auVar5._0_8_
            );
  auVar5 = Jupiter::Config::get(puVar1,0xb,"Join.Format",0x19,"{NAME} has joined {CHAN}!");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->joinFmt,0,(this->joinFmt)._M_string_length,auVar5._8_8_,auVar5._0_8_);
  auVar5 = Jupiter::Config::get(puVar1,0xb,"Part.Format",0x22,"{NAME} has left {CHAN} ({REASON})!");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->partFmt,0,(this->partFmt)._M_string_length,auVar5._8_8_,auVar5._0_8_);
  auVar5 = Jupiter::Config::get(puVar1,0x13,"Part.FormatNoReason",0x17,"{NAME} has left {CHAN}!");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->partFmtNoReason,0,(this->partFmtNoReason)._M_string_length,auVar5._8_8_,
             auVar5._0_8_);
  return true;
}

Assistant:

bool RenX_IRCJoinPlugin::initialize() {
	RenX_IRCJoinPlugin::publicOnly = this->config.get<bool>("PublicOnly"sv, true);
	RenX_IRCJoinPlugin::joinMsgAlways = this->config.get<bool>("Join.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::partMsgAlways = this->config.get<bool>("Part.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::minAccessPartMessage = this->config.get<int>("Part.MinAccess"sv, 0);
	RenX_IRCJoinPlugin::maxAccessPartMessage = this->config.get<int>("Part.MaxAccess"sv, -1);
	RenX_IRCJoinPlugin::nameTag = this->config.get("NameTag"sv, "{NAME}"sv);
	RenX_IRCJoinPlugin::chanTag = this->config.get("ChannelTag"sv, "{CHAN}"sv);
	RenX_IRCJoinPlugin::partReasonTag = this->config.get("PartReasonTag"sv, "{REASON}"sv);
	RenX_IRCJoinPlugin::joinFmt = this->config.get("Join.Format"sv, "{NAME} has joined {CHAN}!"sv);
	RenX_IRCJoinPlugin::partFmt = this->config.get("Part.Format"sv, "{NAME} has left {CHAN} ({REASON})!"sv);
	RenX_IRCJoinPlugin::partFmtNoReason = this->config.get("Part.FormatNoReason"sv, "{NAME} has left {CHAN}!"sv);

	return true;
}